

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

string * unicode_byte_to_utf8_abi_cxx11_(uint8_t byte)

{
  int iVar1;
  iterator iVar2;
  string *in_RDI;
  key_type_conflict3 local_9;
  
  if (unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_);
    if (iVar1 != 0) {
      unicode_byte_to_utf8_map_abi_cxx11_();
      __cxa_atexit(std::
                   unordered_map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_);
    }
  }
  iVar2 = std::
          _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&unicode_byte_to_utf8[abi:cxx11](unsigned_char)::map_abi_cxx11_._M_h,&local_9);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    return in_RDI;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

std::string unicode_byte_to_utf8(uint8_t byte) {
    static std::unordered_map<uint8_t, std::string> map = unicode_byte_to_utf8_map();
    return map.at(byte);
}